

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O3

void __thiscall cbtTaskSchedulerDefault::waitForWorkersToSleep(cbtTaskSchedulerDefault *this)

{
  CProfileSample __profile;
  CProfileSample local_9;
  
  CProfileSample::CProfileSample(&local_9,"waitForWorkersToSleep");
  if (1 < (long)this->m_numThreads) {
    memset(this->m_workerDirective + 1,1,(long)this->m_numThreads - 1);
  }
  (*this->m_threadSupport->_vptr_cbtThreadSupportInterface[6])();
  CProfileSample::~CProfileSample(&local_9);
  return;
}

Assistant:

void waitForWorkersToSleep()
	{
		BT_PROFILE("waitForWorkersToSleep");
		setWorkerDirectives(WorkerThreadDirectives::kGoToSleep);
		m_threadSupport->waitForAllTasks();
		for (int i = kFirstWorkerThreadId; i < m_numThreads; i++)
		{
			ThreadLocalStorage& storage = m_threadLocalStorage[i];
			cbtAssert(storage.m_status == WorkerThreadStatus::kSleeping);
		}
	}